

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateStackScriptFunctionInit
          (Lowerer *this,RegOpnd *regOpnd,FunctionInfoPtrPtr nestedInfo,Opnd *envOpnd,
          Instr *insertBeforeInstr)

{
  Func *func;
  Opnd *vtableAddressOpnd;
  IndirOpnd *dst;
  AddrOpnd *src;
  
  func = this->m_func;
  vtableAddressOpnd = LoadVTableValueOpnd(this,insertBeforeInstr,VtableStackScriptFunction);
  GenerateScriptFunctionInit
            (this,regOpnd,vtableAddressOpnd,nestedInfo,envOpnd,insertBeforeInstr,false);
  dst = IR::IndirOpnd::New(regOpnd,0x48,TyUint64,func,false);
  src = IR::AddrOpnd::NewNull(func);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  return;
}

Assistant:

void
Lowerer::GenerateStackScriptFunctionInit(IR::RegOpnd * regOpnd, Js::FunctionInfoPtrPtr nestedInfo, IR::Opnd * envOpnd, IR::Instr * insertBeforeInstr)
{
    Func * func = this->m_func;
    GenerateScriptFunctionInit(regOpnd,
        LoadVTableValueOpnd(insertBeforeInstr, VTableValue::VtableStackScriptFunction),
        nestedInfo, envOpnd, insertBeforeInstr);
    InsertMove(IR::IndirOpnd::New(regOpnd, Js::StackScriptFunction::GetOffsetOfBoxedScriptFunction(), TyMachPtr, func),
        IR::AddrOpnd::NewNull(func), insertBeforeInstr);
}